

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_Dsd6DecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  bool bVar2;
  ulong *pTruth_00;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  char (*pacVar11) [32];
  long lVar12;
  ulong uVar13;
  int v;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  ulong uVar17;
  int *pVars_00;
  ulong uVar18;
  timespec ts;
  timespec local_98;
  ulong *local_88;
  ulong local_80;
  int *local_78;
  char (*local_70) [32];
  long local_68;
  ulong local_60;
  ulong local_58;
  uint local_4c;
  char (*local_48) [8];
  ulong local_40;
  ulong local_38;
  
  local_88 = pTruth;
  local_78 = pVars;
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    local_68 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT62(local_98.tv_nsec._2_6_,(undefined2)local_98.tv_nsec)),8);
    local_68 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  pacVar11 = p->Cache;
  local_48 = p->pVarDefs;
  pVars_00 = local_78;
  local_70 = pacVar11;
  do {
    uVar6 = nVars - 2;
    uVar15 = (ulong)(uint)nVars;
    while( true ) {
      uVar8 = (ulong)uVar6;
      uVar17 = uVar15 - 1;
      if ((int)uVar15 < 2) break;
      uVar18 = uVar17 & 0xffffffff;
      local_38 = (ulong)(uint)(1 << ((byte)uVar17 & 0x1f));
      bVar16 = true;
      local_80 = uVar18;
      local_58 = uVar17;
      local_4c = uVar6;
      local_40 = uVar15;
      do {
        iVar4 = pVars_00[uVar18];
        v = (int)uVar8;
        if (pacVar11[iVar4][pVars_00[uVar8]] == '\0') {
          local_98.tv_nsec._0_2_ = 0;
          local_98.tv_sec = 0;
          if (6 < uVar15) {
LAB_00507dd1:
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x337,"word Abc_Tt6Cofactor0(word, int)");
          }
          uVar17 = s_Truths6Neg[uVar18] & *local_88;
          uVar15 = *local_88 & s_Truths6[uVar18];
          if (p == (Dau_Dsd_t *)0x0) {
            iVar5 = 0;
          }
          else {
            iVar5 = (int)pacVar11[iVar4][pVars_00[uVar8]];
          }
          uVar17 = uVar17 << ((byte)local_38 & 0x3f) | uVar17;
          uVar15 = uVar15 >> ((byte)local_38 & 0x3f) | uVar15;
          bVar10 = (byte)uVar8;
          if ((iVar5 == 0) &&
             (bVar9 = (byte)(1 << (bVar10 & 0x1f)),
             iVar5 = (uint)((s_Truths6Neg[uVar8] & (uVar17 >> (bVar9 & 0x3f) ^ uVar17)) != 0) +
                     (uint)((s_Truths6Neg[uVar8] & (uVar15 >> (bVar9 & 0x3f) ^ uVar15)) != 0) * 2,
             p != (Dau_Dsd_t *)0x0)) {
            iVar1 = pVars_00[uVar8];
            if (iVar4 == iVar1) {
              __assert_fail("v != u",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
            }
            if (2 < iVar5 - 1U) {
              __assert_fail("Status > 0 && Status < 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
            }
            if (pacVar11[iVar4][iVar1] != '\0') {
              __assert_fail("p->Cache[v][u] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x45b,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
            }
            pacVar11[iVar4][iVar1] = (char)iVar5;
          }
          if ((int)local_58 <= v) {
            __assert_fail("v > u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                          ,0x4ef,
                          "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                         );
          }
          uVar6 = nVars;
          if (iVar5 == 1) {
            uVar14 = 1 << (bVar10 & 0x1f);
            bVar10 = (byte)uVar14;
            uVar18 = s_Truths6Neg[uVar8];
            if ((uVar18 & (uVar15 >> (bVar10 & 0x3f) ^ uVar17)) == 0) {
              sprintf((char *)&local_98,"(!%c%c)",(ulong)(pVars_00[local_80] + 0x61),
                      (ulong)(pVars_00[uVar8] + 0x61));
              if (5 < uVar8) {
LAB_00507ec9:
                __assert_fail("iVar >= 0 && iVar < 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
              }
              uVar15 = (uVar18 & uVar17) << (bVar10 & 0x3f) | uVar18 & uVar17;
              *local_88 = (((s_Truths6[uVar8] & uVar17) >> (bVar10 & 0x3f) | uVar17) ^ uVar15) &
                          s_Truths6[uVar8] ^ uVar15;
            }
            else {
              local_60 = (ulong)uVar14;
              if ((s_Truths6[uVar8] & (uVar15 ^ uVar17)) != 0) goto LAB_00507c93;
              sprintf((char *)&local_98,"(!%c!%c)",(ulong)(pVars_00[local_80] + 0x61),
                      (ulong)(pVars_00[uVar8] + 0x61));
              if (5 < uVar8) goto LAB_00507dd1;
              uVar13 = (uVar15 & s_Truths6[uVar8]) >> ((byte)local_60 & 0x3f);
              uVar13 = (((uVar18 & uVar17) << ((byte)local_60 & 0x3f) | uVar18 & uVar17) ^ uVar13) &
                       s_Truths6[uVar8] ^ uVar13;
LAB_00507a89:
              *local_88 = uVar13;
            }
LAB_00507b79:
            if ((char)local_98.tv_sec == '\0') {
              __assert_fail("pBuffer[0]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x520,
                            "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                           );
            }
            sVar7 = strlen((char *)&local_98);
            if (7 < sVar7) {
              __assert_fail("strlen(pStr) < 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            uVar6 = p->nVarsUsed;
            uVar15 = (ulong)uVar6;
            if (0x1f < (int)uVar6) {
              __assert_fail("p->nVarsUsed < 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
            }
            if (0 < (int)uVar6) {
              lVar12 = 0;
              do {
                local_70[(int)uVar15][lVar12] = '\0';
                lVar12 = lVar12 + 1;
                uVar15 = (ulong)p->nVarsUsed;
              } while (lVar12 < (long)uVar15);
            }
            uVar6 = p->nVarsUsed;
            uVar15 = (ulong)uVar6;
            if (0 < (int)uVar6) {
              lVar12 = 0;
              pacVar11 = local_70;
              do {
                (*pacVar11)[(int)uVar15] = '\0';
                lVar12 = lVar12 + 1;
                uVar6 = p->nVarsUsed;
                uVar15 = (ulong)(int)uVar6;
                pacVar11 = pacVar11 + 1;
              } while (lVar12 < (long)uVar15);
            }
            p->nVarsUsed = uVar6 + 1;
            strcpy(local_48[(int)uVar6],(char *)&local_98);
            pVars_00 = local_78;
            pTruth_00 = local_88;
            local_78[uVar8] = p->nVarsUsed + -1;
            uVar6 = nVars - 1;
            local_78[local_80] = local_78[(long)nVars + -1];
            Abc_TtSwapVars(local_88,nVars,(int)local_58,uVar6);
            iVar4 = Dau_Dsd6DecomposeSingleVarOne(p,pTruth_00,pVars_00,uVar6,v);
            pacVar11 = local_70;
            if (iVar4 != 0) {
              uVar6 = Dau_Dsd6DecomposeSingleVar(p,local_88,pVars_00,nVars - 2);
              pVars_00 = local_78;
              pacVar11 = local_70;
            }
          }
          else if (iVar5 == 2) {
            uVar18 = s_Truths6Neg[uVar8];
            if ((uVar18 & (uVar15 ^ uVar17)) == 0) {
              sprintf((char *)&local_98,"(%c%c)",(ulong)(pVars_00[local_80] + 0x61),
                      (ulong)(pVars_00[uVar8] + 0x61));
              if (5 < uVar8) goto LAB_00507ec9;
              bVar10 = (byte)(1 << (bVar10 & 0x1f));
              uVar17 = (uVar18 & uVar17) << (bVar10 & 0x3f) | uVar18 & uVar17;
              *local_88 = (((s_Truths6[uVar8] & uVar15) >> (bVar10 & 0x3f) | uVar15) ^ uVar17) &
                          s_Truths6[uVar8] ^ uVar17;
              goto LAB_00507b79;
            }
            uVar14 = 1 << (bVar10 & 0x1f);
            if ((uVar18 & (uVar15 >> ((byte)uVar14 & 0x3f) ^ uVar17)) == 0) {
              local_60 = (ulong)uVar14;
              sprintf((char *)&local_98,"(%c!%c)",(ulong)(pVars_00[local_80] + 0x61),
                      (ulong)(pVars_00[uVar8] + 0x61));
              if (5 < uVar8) goto LAB_00507dd1;
              uVar13 = (uVar17 & uVar18) << ((byte)local_60 & 0x3f) | uVar17 & uVar18;
              uVar13 = (((uVar15 & uVar18) << ((byte)local_60 & 0x3f) | uVar15 & uVar18) ^ uVar13) &
                       s_Truths6[uVar8] ^ uVar13;
              goto LAB_00507a89;
            }
          }
          else if (iVar5 == 3) {
            bVar10 = (byte)(1 << (bVar10 & 0x1f));
            uVar18 = s_Truths6Neg[uVar8];
            if (((uVar18 & (uVar15 >> (bVar10 & 0x3f) ^ uVar17)) == 0) &&
               ((uVar18 & (uVar17 >> (bVar10 & 0x3f) ^ uVar15)) == 0)) {
              if (5 < uVar8) goto LAB_00507ec9;
              uVar15 = (uVar18 & uVar17) << (bVar10 & 0x3f) | uVar18 & uVar17;
              *local_88 = (((s_Truths6[uVar8] & uVar17) >> (bVar10 & 0x3f) | uVar17) ^ uVar15) &
                          s_Truths6[uVar8] ^ uVar15;
              sprintf((char *)&local_98,"[%c%c]",(ulong)(pVars_00[local_80] + 0x61));
              goto LAB_00507b79;
            }
          }
LAB_00507c93:
          if (uVar6 == 0) {
            iVar4 = clock_gettime(3,&local_98);
            if (iVar4 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = CONCAT62(local_98.tv_nsec._2_6_,(undefined2)local_98.tv_nsec) / 1000 +
                       local_98.tv_sec * 1000000;
            }
            s_Times_1 = s_Times_1 + lVar12 + local_68;
            cVar3 = '\x01';
            nVars = 0;
            pVars_00 = local_78;
            pacVar11 = local_70;
            goto LAB_00507d5c;
          }
          bVar2 = (int)uVar6 < nVars;
          uVar15 = local_40;
          uVar18 = local_80;
          nVars = uVar6;
          if (bVar2) break;
        }
        uVar8 = uVar8 - 1;
        bVar16 = 0 < v;
      } while (0 < v);
      uVar6 = local_4c - 1;
      uVar17 = local_58;
      uVar15 = local_58;
      if (bVar16) break;
    }
    cVar3 = ((int)uVar17 == 0) * '\x03';
LAB_00507d5c:
    if (cVar3 != '\0') {
      if (cVar3 == '\x03') {
        iVar4 = clock_gettime(3,&local_98);
        if (iVar4 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = CONCAT62(local_98.tv_nsec._2_6_,(undefined2)local_98.tv_nsec) / 1000 +
                   local_98.tv_sec * 1000000;
        }
        s_Times_1 = s_Times_1 + lVar12 + local_68;
      }
      else {
        nVars = 0;
      }
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_Dsd6DecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}